

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O2

void QGraphicsSceneBspTreeIndexPrivate::climbTree(QGraphicsItem *item,int *stackingOrder)

{
  int iVar1;
  QGraphicsItemPrivate *pQVar2;
  GraphicsItemFlags GVar3;
  iterator __first;
  iterator __last;
  int i_1;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QGraphicsItem_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (item->d_ptr).d;
  uVar4 = (pQVar2->children).d.size;
  if (uVar4 == 0) {
    iVar1 = *stackingOrder;
    *stackingOrder = iVar1 + 1;
    pQVar2->globalStackingOrder = iVar1;
  }
  else {
    local_40.d = (pQVar2->children).d.d;
    local_40.ptr = (pQVar2->children).d.ptr;
    if (local_40.d != (Data *)0x0) {
      LOCK();
      ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_40.size = uVar4;
    __first = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)&local_40);
    __last = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)&local_40);
    std::
    __sort<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
              (__first,__last,
               (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5837c1);
    for (uVar4 = 0; uVar4 < (ulong)local_40.size; uVar4 = uVar4 + 1) {
      GVar3 = QGraphicsItem::flags(local_40.ptr[uVar4]);
      if (((uint)GVar3.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                 super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i >> 8 & 1) == 0) {
        climbTree(local_40.ptr[uVar4],stackingOrder);
      }
    }
    iVar1 = *stackingOrder;
    *stackingOrder = iVar1 + 1;
    ((item->d_ptr).d)->globalStackingOrder = iVar1;
    for (uVar4 = 0; uVar4 < (ulong)local_40.size; uVar4 = uVar4 + 1) {
      GVar3 = QGraphicsItem::flags(local_40.ptr[uVar4]);
      if (((uint)GVar3.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                 super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i >> 8 & 1) != 0) {
        climbTree(local_40.ptr[uVar4],stackingOrder);
      }
    }
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::climbTree(QGraphicsItem *item, int *stackingOrder)
{
    if (!item->d_ptr->children.isEmpty()) {
        QList<QGraphicsItem *> childList = item->d_ptr->children;
        std::sort(childList.begin(), childList.end(), qt_closestLeaf);
        for (int i = 0; i < childList.size(); ++i) {
            QGraphicsItem *item = childList.at(i);
            if (!(item->flags() & QGraphicsItem::ItemStacksBehindParent))
                climbTree(childList.at(i), stackingOrder);
        }
        item->d_ptr->globalStackingOrder = (*stackingOrder)++;
        for (int i = 0; i < childList.size(); ++i) {
            QGraphicsItem *item = childList.at(i);
            if (item->flags() & QGraphicsItem::ItemStacksBehindParent)
                climbTree(childList.at(i), stackingOrder);
        }
    } else {
        item->d_ptr->globalStackingOrder = (*stackingOrder)++;
    }
}